

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadraticTetra>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZQuadraticTetra> *this,TPZVec<long> *nodeindices,int matind,
          TPZGeoMesh *mesh,int64_t *index)

{
  undefined4 in_EDX;
  TPZGeoMesh *in_RSI;
  TPZRegisterClassId *in_RDI;
  TPZVec<long> *unaff_retaddr;
  void **in_stack_00000008;
  TPZGeoElRefLess<pzgeom::TPZQuadraticTetra> *in_stack_00000010;
  undefined4 in_stack_ffffffffffffffe8;
  TPZRegisterClassId *pTVar1;
  int matind_00;
  
  pTVar1 = in_RDI;
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefPattern<pzgeom::TPZQuadraticTetra>>(in_RDI,0x21)
  ;
  matind_00 = (int)((ulong)pTVar1 >> 0x20);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02470860);
  TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>::TPZGeoElRefLess
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,matind_00,in_RSI,
             (int64_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefPattern_02470538;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefPattern_02470538;
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI + 0x200));
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)in_RDI);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh, int64_t &index) :
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(nodeindices,matind,mesh,index)
{
}